

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * __thiscall
CodeGen::doGenerateType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  peVar1 = n->px;
  switch(peVar1->type_) {
  case AVRO_STRING:
  case AVRO_BYTES:
  case AVRO_INT:
  case AVRO_LONG:
  case AVRO_FLOAT:
  case AVRO_DOUBLE:
  case AVRO_BOOL:
  case AVRO_NULL:
  case AVRO_FIXED:
    cppTypeOf_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_RECORD:
    generateRecordType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_ENUM:
    generateEnumType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  case AVRO_ARRAY:
    iVar3 = (*peVar1->_vptr_Node[5])(peVar1,0);
    generateType_abi_cxx11_(&local_38,this,(NodePtr *)CONCAT44(extraout_var,iVar3));
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x17629c);
    local_58 = &local_48;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_48 = *plVar5;
      lStack_40 = plVar4[3];
    }
    else {
      local_48 = *plVar5;
      local_58 = (long *)*plVar4;
    }
    local_50 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
    goto LAB_001489a2;
  case AVRO_MAP:
    iVar3 = (*peVar1->_vptr_Node[5])(peVar1,1);
    generateType_abi_cxx11_(&local_38,this,(NodePtr *)CONCAT44(extraout_var_00,iVar3));
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x1762ac);
    local_58 = &local_48;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_48 = *plVar5;
      lStack_40 = plVar4[3];
    }
    else {
      local_48 = *plVar5;
      local_58 = (long *)*plVar4;
    }
    local_50 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
LAB_001489a2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    break;
  case AVRO_UNION:
    generateUnionType_abi_cxx11_(__return_storage_ptr__,this,n);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"$Undefuned$","");
  }
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::doGenerateType(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_STRING:
    case avro::AVRO_BYTES:
    case avro::AVRO_INT:
    case avro::AVRO_LONG:
    case avro::AVRO_FLOAT:
    case avro::AVRO_DOUBLE:
    case avro::AVRO_BOOL:
    case avro::AVRO_NULL:
    case avro::AVRO_FIXED:
        return cppTypeOf(n);
    case avro::AVRO_ARRAY:
        return "std::vector<" + generateType(n->leafAt(0)) + " >";
    case avro::AVRO_MAP:
        return "std::map<std::string, " + generateType(n->leafAt(1)) + " >";
    case avro::AVRO_RECORD:
        return generateRecordType(n);
    case avro::AVRO_ENUM:
        return generateEnumType(n);
    case avro::AVRO_UNION:
        return generateUnionType(n);
    default:
        break;
    }
    return "$Undefuned$";
}